

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void OpenMesh::IO::assignCustomProperty<float>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar3;
  value_type local_3c;
  float in;
  VPropHandleT<float> prop;
  
  in = -NAN;
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  bVar1 = BaseKernel::get_property_handle<float>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar2),(VPropHandleT<float> *)&in,_propName
                    );
  if (!bVar1) {
    iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<float>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar2),(VPropHandleT<float> *)&in,_propName);
  }
  std::istream::_M_extract<float>((float *)_in);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar3 = BaseKernel::property<float>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar2),(VPropHandleT<float>)in,_vh);
  *pvVar3 = local_3c;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}